

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int find_column(ParseData *lParse,char *colName,void *itslval)

{
  int iVar1;
  int iVar2;
  fitsfile *infptr;
  iteratorCol *col;
  long *in_RDX;
  fitsfile *in_RSI;
  undefined8 *in_RDI;
  int i;
  iteratorCol *colIter;
  DataInfo *varInfo;
  int istatus;
  double tscale;
  double tzero;
  char temp [80];
  fitsfile *fptr;
  long width;
  long repeat;
  int type;
  int typecode;
  int colnum;
  int status;
  int col_cnt;
  FITS_PARSER_YYSTYPE *thelval;
  long *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar3;
  long *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  fitsfile *in_stack_ffffffffffffff48;
  double in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  fitsfile *in_stack_ffffffffffffff80;
  iteratorCol *in_stack_ffffffffffffff90;
  DataInfo *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  ParseData *in_stack_ffffffffffffffa8;
  fitsfile *name;
  ParseData *lParse_00;
  FITSfile *in_stack_ffffffffffffffb0;
  FITSfile *in_stack_ffffffffffffffb8;
  int local_3c;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int iVar4;
  long *plVar5;
  
  plVar5 = in_RDX;
  if (DEBUG_PIXFILTER != 0) {
    printf("find_column(%s)\n",in_RSI);
  }
  if ((char)in_RSI->HDUposition == '#') {
    iVar1 = find_keywd(in_stack_ffffffffffffffa8,
                       (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
    return iVar1;
  }
  lParse_00 = (ParseData *)*in_RDI;
  iVar4 = 0;
  iVar1 = *(int *)(in_RDI + 0xc);
  if (*(int *)((long)in_RDI + 0xdc) == 0) {
    if (in_RDI[0x16] == 0) {
      *(undefined4 *)(in_RDI + 0x1c) = 0xdb;
      ffpmsg((char *)0x136ef0);
      return -1;
    }
    in_stack_ffffffffffffffcc = 0xffffffff;
    for (uVar3 = 0; (int)uVar3 < *(int *)in_RDI[0x16]; uVar3 = uVar3 + 1) {
      iVar2 = fits_strcasecmp((char *)CONCAT44(uVar3,in_stack_ffffffffffffff28),
                              (char *)in_stack_ffffffffffffff20);
      if (iVar2 == 0) {
        in_stack_ffffffffffffffcc = uVar3;
      }
    }
    if ((int)in_stack_ffffffffffffffcc < 0) {
      snprintf(&stack0xffffffffffffff58,0x50,"find_column: PixelFilter tag %s not found",in_RSI);
      ffpmsg((char *)0x136fa6);
      *(undefined4 *)(in_RDI + 0x1c) = 0xdb;
      return -1;
    }
    iVar2 = fits_parser_allocateCol
                      ((ParseData *)CONCAT44(uVar3,in_stack_ffffffffffffff28),
                       (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       (int *)in_stack_ffffffffffffff18);
    if (iVar2 != 0) {
      return -1;
    }
    infptr = (fitsfile *)(in_RDI[0x15] + (long)iVar1 * 0xa0);
    col = (iteratorCol *)(in_RDI[0x14] + (long)iVar1 * 0x110);
    name = *(fitsfile **)(*(long *)(in_RDI[0x16] + 0x18) + (long)(int)in_stack_ffffffffffffffcc * 8)
    ;
    ffgipr(infptr,(int)((ulong)col >> 0x20),(int *)CONCAT44(uVar3,in_stack_ffffffffffffff28),
           in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(int *)0x1370a7);
    infptr[5].Fptr = (FITSfile *)0x1;
    local_3c = 0x10e;
    iVar2 = set_image_col_types((ParseData *)in_stack_ffffffffffffffb8,
                                (fitsfile *)in_stack_ffffffffffffffb0,(char *)name,
                                in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                                in_stack_ffffffffffffff90);
    if (iVar2 != 0) {
      return -1;
    }
    col->fptr = name;
    col->iotype = 0;
  }
  else {
    if (*(int *)(in_RDI + 3) == 0) {
      iVar2 = ffgcno(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      if (iVar2 != 0) {
        if (iVar4 != 0xdb) {
          *(int *)(in_RDI + 0x1c) = iVar4;
          return -1;
        }
        iVar1 = find_keywd(lParse_00,
                           (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
        if (iVar1 == -1) {
          return -1;
        }
        ffcmsg();
        return iVar1;
      }
    }
    else {
      in_stack_ffffffffffffffcc = *(uint *)((long)in_RDI + 0x24);
    }
    iVar2 = ffgtcl(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,
                   (long *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff20);
    if (iVar2 != 0) {
      *(int *)(in_RDI + 0x1c) = iVar4;
      return -1;
    }
    iVar2 = fits_parser_allocateCol
                      ((ParseData *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       (int *)in_stack_ffffffffffffff18);
    if (iVar2 != 0) {
      return -1;
    }
    infptr = (fitsfile *)(in_RDI[0x15] + (long)iVar1 * 0xa0);
    col = (iteratorCol *)(in_RDI[0x14] + (long)iVar1 * 0x110);
    fits_iter_set_by_num(col,(fitsfile *)lParse_00,in_stack_ffffffffffffffcc,0,0);
  }
  strncpy((char *)infptr,(char *)in_RSI,0x50);
  *(undefined1 *)&infptr[5].HDUposition = 0;
  if (*(int *)((long)in_RDI + 0xdc) != 0) {
    switch(in_stack_ffffffffffffffc8) {
    case 1:
      *(undefined4 *)&infptr[5].field_0x4 = 0x106;
      col->datatype = 0xb;
      local_3c = 0x111;
      break;
    default:
      if ((int)in_stack_ffffffffffffffc8 < 0) {
        snprintf(&stack0xffffffffffffff58,0x50,
                 "variable-length array columns are not supported. typecode = %d",
                 (ulong)in_stack_ffffffffffffffc8);
        ffpmsg((char *)0x1375de);
      }
      *(undefined4 *)(in_RDI + 0x1c) = 0x1b0;
      return -1;
    case 0xb:
    case 0x15:
    case 0x29:
      snprintf(&stack0xffffffffffffff58,0x50,"TZERO%d",(ulong)in_stack_ffffffffffffffcc);
      iVar2 = ffgky(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                    (char *)in_stack_ffffffffffffff48,(void *)(ulong)in_stack_ffffffffffffff40,
                    (char *)infptr,(int *)col);
      if (iVar2 != 0) {
        in_stack_ffffffffffffff50 = 0.0;
      }
      snprintf(&stack0xffffffffffffff58,0x50,"TSCAL%d",(ulong)in_stack_ffffffffffffffcc);
      iVar2 = ffgky(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                    (char *)in_stack_ffffffffffffff48,(void *)(ulong)in_stack_ffffffffffffff40,
                    (char *)infptr,(int *)col);
      if (iVar2 != 0) {
        in_stack_ffffffffffffff48 = (fitsfile *)0x3ff0000000000000;
      }
      if ((((double)in_stack_ffffffffffffff48 != 1.0) || (NAN((double)in_stack_ffffffffffffff48)))
         || (((in_stack_ffffffffffffff50 != 0.0 || (NAN(in_stack_ffffffffffffff50))) &&
             ((in_stack_ffffffffffffff50 != 32768.0 || (NAN(in_stack_ffffffffffffff50))))))) {
        *(undefined4 *)&infptr[5].field_0x4 = 0x104;
        col->datatype = 0x52;
      }
      else {
        *(undefined4 *)&infptr[5].field_0x4 = 0x103;
        col->datatype = 0x29;
      }
      local_3c = 0x10e;
      break;
    case 0xe:
      *(undefined4 *)&infptr[5].field_0x4 = 0x102;
      col->datatype = 0xe;
      local_3c = 0x10f;
      break;
    case 0x10:
      *(undefined4 *)&infptr[5].field_0x4 = 0x105;
      col->datatype = 0x10;
      local_3c = 0x110;
      if (0xff < (long)in_stack_ffffffffffffffb0) {
        snprintf(&stack0xffffffffffffff58,0x50,"column %d is wider than maximum %d characters",
                 (ulong)in_stack_ffffffffffffffcc,0xff);
        ffpmsg((char *)0x137566);
        *(undefined4 *)(in_RDI + 0x1c) = 0x1b1;
        return -1;
      }
      if (*(int *)((long)in_RDI + 0xdc) == 1) {
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb0;
      }
      break;
    case 0x2a:
    case 0x51:
    case 0x52:
      *(undefined4 *)&infptr[5].field_0x4 = 0x104;
      col->datatype = 0x52;
      local_3c = 0x10e;
    }
    infptr[5].Fptr = in_stack_ffffffffffffffb8;
    col->repeat = 0;
    if (((long)in_stack_ffffffffffffffb8 < 2) || (in_stack_ffffffffffffffc8 == 0x10)) {
      infptr[6].HDUposition = 1;
      infptr[6].Fptr = (FITSfile *)0x1;
    }
    else {
      iVar2 = ffgtdm(in_RSI,(int)((ulong)plVar5 >> 0x20),(int)plVar5,(int *)in_RDX,
                     (long *)CONCAT44(iVar1,iVar4),
                     (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (iVar2 != 0) {
        *(int *)(in_RDI + 0x1c) = iVar4;
        return -1;
      }
    }
  }
  *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
  *in_RDX = (long)iVar1;
  return local_3c;
}

Assistant:

static int find_column( ParseData *lParse, char *colName, void *itslval )
{
   FITS_PARSER_YYSTYPE *thelval = (FITS_PARSER_YYSTYPE*)itslval;
   int col_cnt, status;
   int colnum, typecode, type;
   long repeat, width;
   fitsfile *fptr;
   char temp[80];
   double tzero,tscale;
   int istatus;
   DataInfo *varInfo;
   iteratorCol *colIter;

if (DEBUG_PIXFILTER)
   printf("find_column(%s)\n", colName);

   if( *colName == '#' )
     return( find_keywd( lParse, colName + 1, itslval ) );

   fptr = lParse->def_fptr;

   status = 0;
   col_cnt = lParse->nCols;

if (lParse->hdutype == IMAGE_HDU) {
   int i;
   if (!lParse->pixFilter) {
      lParse->status = COL_NOT_FOUND;
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
      return pERROR;
   }

   colnum = -1;
   for (i = 0; i < lParse->pixFilter->count; ++i) {
      if (!fits_strcasecmp(colName, lParse->pixFilter->tag[i]))
         colnum = i;
   }
   if (colnum < 0) {
      snprintf(temp, 80, "find_column: PixelFilter tag %s not found", colName);
      ffpmsg(temp);
      lParse->status = COL_NOT_FOUND;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fptr = lParse->pixFilter->ifptr[colnum];
   fits_get_img_param(fptr,
                MAXDIMS,
                &typecode, /* actually bitpix */
                &varInfo->naxis,
                &varInfo->naxes[0],
                &status);
   varInfo->nelem = 1;
   type = COLUMN;
   if (set_image_col_types(lParse, fptr, colName, typecode, varInfo, colIter))
      return pERROR;
   colIter->fptr = fptr;
   colIter->iotype = InputCol;
}
else { /* HDU holds a table */
   if( lParse->compressed )
      colnum = lParse->valCol;
   else
      if( fits_get_colnum( fptr, CASEINSEN, colName, &colnum, &status ) ) {
         if( status == COL_NOT_FOUND ) {
	   type = find_keywd( lParse, colName, itslval );
            if( type != pERROR ) ffcmsg();
            return( type );
         }
         lParse->status = status;
         return pERROR;
      }
   
   if( fits_get_coltype( fptr, colnum, &typecode,
                         &repeat, &width, &status ) ) {
      lParse->status = status;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fits_iter_set_by_num( colIter, fptr, colnum, 0, InputCol );
}

   /*  Make sure we don't overflow variable name array  */
   strncpy(varInfo->name,colName,MAXVARNAME);
   varInfo->name[MAXVARNAME] = '\0';

if (lParse->hdutype != IMAGE_HDU) {
   switch( typecode ) {
   case TBIT:
      varInfo->type     = BITSTR;
      colIter->datatype = TBYTE;
      type = BITCOL;
      break;
   case TBYTE:
   case TSHORT:
   case TLONG:
      /* The datatype of column with TZERO and TSCALE keywords might be 
         float or double. 
      */
      snprintf(temp,80,"TZERO%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tzero,NULL,&istatus)) {
          tzero = 0.0;
      } 
      snprintf(temp,80,"TSCAL%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tscale,NULL,&istatus)) {
          tscale = 1.0;
      } 
      if (tscale == 1.0 && (tzero == 0.0 || tzero == 32768.0 )) {
          varInfo->type     = LONG;
          colIter->datatype = TLONG;
/*    Reading an unsigned long column as a long can cause overflow errors.
      Treat the column as a double instead.
      } else if (tscale == 1.0 &&  tzero == 2147483648.0 ) {
          varInfo->type     = LONG;
          colIter->datatype = TULONG;
 */

      }
      else {
          varInfo->type     = DOUBLE;
          colIter->datatype = TDOUBLE;
      }
      type = COLUMN;
      break;
/* 
  For now, treat 8-byte integer columns as type double.
  This can lose precision, so the better long term solution
  will be to add support for TLONGLONG as a separate datatype.
*/
   case TLONGLONG:
   case TFLOAT:
   case TDOUBLE:
      varInfo->type     = DOUBLE;
      colIter->datatype = TDOUBLE;
      type = COLUMN;
      break;
   case TLOGICAL:
      varInfo->type     = BOOLEAN;
      colIter->datatype = TLOGICAL;
      type = BCOLUMN;
      break;
   case TSTRING:
      varInfo->type     = STRING;
      colIter->datatype = TSTRING;
      type = SCOLUMN;
      if ( width >= MAX_STRLEN ) {
	snprintf(temp, 80, "column %d is wider than maximum %d characters",
		colnum, MAX_STRLEN-1);
        ffpmsg(temp);
	lParse->status = PARSE_LRG_VECTOR;
	return pERROR;
      }
      if( lParse->hdutype == ASCII_TBL ) repeat = width;
      break;
   default:
      if (typecode < 0) {
        snprintf(temp, 80,"variable-length array columns are not supported. typecode = %d", typecode);
        ffpmsg(temp);
      }
      lParse->status = PARSE_BAD_TYPE;
      return pERROR;
   }
   varInfo->nelem = repeat;
   colIter->repeat = 0; /* ffiter() will fill in this value */
   if( repeat>1 && typecode!=TSTRING ) {
      if( fits_read_tdim( fptr, colnum, MAXDIMS,
                          &varInfo->naxis,
                          &varInfo->naxes[0], &status )
          ) {
         lParse->status = status;
         return pERROR;
      }
   } else {
      varInfo->naxis = 1;
      varInfo->naxes[0] = 1;
   }
}
   lParse->nCols++;
   thelval->lng = col_cnt;

   return( type );
}